

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

Gia_Man_t * Gia_ManDupWithMuxPos(Gia_Man_t *p)

{
  int *__base;
  ulong uVar1;
  Vec_Int_t *p_00;
  uint uVar2;
  Gia_Man_t *p_01;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int i;
  int iVar7;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  Vec_Bit_t *p_04;
  Vec_Bit_t *p_05;
  Gia_Man_t *p_06;
  Gia_Obj_t *pGVar8;
  Gia_Obj_t *pGVar9;
  size_t sVar10;
  uint *puVar11;
  int Entry;
  int Entry_00;
  int Entry_01;
  long lVar12;
  int iVar13;
  size_t __nmemb;
  Gia_Obj_t *pGVar14;
  uint uVar15;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pData1;
  Gia_Obj_t *pData0;
  Gia_Man_t *local_40;
  Gia_Obj_t *local_38;
  
  p_02 = Vec_IntAlloc(1000);
  p_03 = Vec_IntAlloc(1000);
  p_04 = Vec_BitStart(p->nObjs);
  p_05 = Vec_BitStart(p->nObjs);
  local_40 = p;
  p_06 = Gia_ManDup(p);
  if (p_06->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(pNew) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                  ,0x8d2,"Gia_Man_t *Gia_ManDupWithMuxPos(Gia_Man_t *)");
  }
  for (iVar13 = 0; iVar13 < p_06->nObjs; iVar13 = iVar13 + 1) {
    pGVar8 = Gia_ManObj(p_06,iVar13);
    if (pGVar8 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar8 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar8) {
      iVar3 = Gia_ObjIsMuxType(pGVar8);
      if (iVar3 != 0) {
        pGVar9 = Gia_ObjRecognizeMux(pGVar8,&pData1,&pData0);
        pObj = (Gia_Obj_t *)((ulong)pData0 & 0xfffffffffffffffe);
        pGVar14 = (Gia_Obj_t *)((ulong)pData1 & 0xfffffffffffffffe);
        pData1 = pGVar14;
        pData0 = pObj;
        iVar3 = Gia_ObjId(p_06,pGVar8);
        iVar4 = Gia_ObjId(p_06,(Gia_Obj_t *)((ulong)pGVar9 & 0xfffffffffffffffe));
        Vec_IntPushTwo(p_03,iVar3,iVar4);
        iVar3 = Gia_ObjId(p_06,pObj);
        iVar4 = Gia_ObjId(p_06,pGVar14);
        Vec_IntPushTwo(p_03,iVar3,iVar4);
        iVar3 = Gia_ObjId(p_06,pGVar8);
        Vec_BitWriteEntry(p_04,iVar3,Entry);
        iVar3 = Gia_ObjId(p_06,pObj);
        Vec_BitWriteEntry(p_05,iVar3,Entry_00);
        iVar3 = Gia_ObjId(p_06,pGVar14);
        Vec_BitWriteEntry(p_05,iVar3,Entry_01);
      }
    }
  }
  for (iVar13 = 0; iVar13 < p_06->vCos->nSize; iVar13 = iVar13 + 1) {
    pGVar8 = Gia_ManCo(p_06,iVar13);
    if (pGVar8 == (Gia_Obj_t *)0x0) break;
    *(ulong *)(pGVar8 + -(ulong)((uint)*(undefined8 *)pGVar8 & 0x1fffffff)) =
         *(ulong *)(pGVar8 + -(ulong)((uint)*(undefined8 *)pGVar8 & 0x1fffffff)) | 0x40000000;
  }
  iVar13 = p_03->nSize / 4;
  iVar3 = 0;
  if (iVar13 < 1) {
    iVar13 = iVar3;
  }
  do {
    if (iVar13 << 2 == iVar3) {
      Gia_ManCleanMark0(p_06);
      iVar13 = p_02->nSize;
      __nmemb = (size_t)iVar13;
      if (1 < (long)__nmemb) {
        __base = p_02->pArray;
        qsort(__base,__nmemb,4,Vec_IntSortCompare1);
        iVar13 = 1;
        for (sVar10 = 1; __nmemb != sVar10; sVar10 = sVar10 + 1) {
          if (__base[sVar10] != __base[sVar10 - 1]) {
            lVar12 = (long)iVar13;
            iVar13 = iVar13 + 1;
            __base[lVar12] = __base[sVar10];
          }
        }
        p_02->nSize = iVar13;
      }
      if (iVar13 < 1) {
        iVar13 = 0;
      }
      iVar3 = 0;
      do {
        if (iVar13 == iVar3) {
          Vec_IntFree(p_02);
          Vec_IntFree(p_03);
          Vec_BitFree(p_04);
          Vec_BitFree(p_05);
          return p_06;
        }
        iVar4 = Vec_IntEntry(p_02,iVar3);
        iVar4 = Abc_Var2Lit(iVar4,0);
        iVar5 = Abc_Lit2Var(iVar4);
        if (p_06->nObjs <= iVar5) {
          __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x314,"int Gia_ManAppendCo(Gia_Man_t *, int)");
        }
        iVar5 = Abc_Lit2Var(iVar4);
        pGVar8 = Gia_ManObj(p_06,iVar5);
        if ((~*(uint *)pGVar8 & 0x1fffffff) != 0 && (int)*(uint *)pGVar8 < 0) {
          __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
        }
        uVar15 = p_06->nObjs;
        if (uVar15 == p_06->nObjsAlloc) {
          uVar2 = uVar15 * 2;
          if (0x1fffffff < (int)(uVar15 * 2)) {
            uVar2 = 0x20000000;
          }
          if (uVar15 == 0x20000000) {
            puts("Hard limit on the number of nodes (2^29) is reached. Quitting...");
            exit(1);
          }
          if ((int)uVar2 <= (int)uVar15) {
            __assert_fail("p->nObjs < nObjNew",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x288,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
          }
          if (p_06->fVerbose != 0) {
            printf("Extending GIA object storage: %d -> %d.\n",(ulong)uVar15,(ulong)uVar2);
            uVar15 = p_06->nObjsAlloc;
          }
          if ((int)uVar15 < 1) {
            __assert_fail("p->nObjsAlloc > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x28b,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
          }
          lVar12 = (long)(int)uVar2;
          if (p_06->pObjs == (Gia_Obj_t *)0x0) {
            pGVar8 = (Gia_Obj_t *)malloc(lVar12 * 0xc);
          }
          else {
            pGVar8 = (Gia_Obj_t *)realloc(p_06->pObjs,lVar12 * 0xc);
            uVar15 = p_06->nObjsAlloc;
          }
          p_06->pObjs = pGVar8;
          memset(pGVar8 + (int)uVar15,0,(long)(int)(uVar2 - uVar15) * 0xc);
          if (p_06->pMuxes != (uint *)0x0) {
            puVar11 = (uint *)realloc(p_06->pMuxes,lVar12 * 4);
            p_06->pMuxes = puVar11;
            memset(puVar11 + p_06->nObjsAlloc,0,(lVar12 - p_06->nObjsAlloc) * 4);
          }
          p_06->nObjsAlloc = uVar2;
        }
        if ((p_06->vHTable).nSize != 0) {
          Vec_IntPush(&p_06->vHash,0);
        }
        iVar5 = p_06->nObjs;
        p_06->nObjs = iVar5 + 1;
        pGVar8 = Gia_ManObj(p_06,iVar5);
        pGVar8->field_0x3 = pGVar8->field_0x3 | 0x80;
        iVar5 = Gia_ObjId(p_06,pGVar8);
        iVar6 = Abc_Lit2Var(iVar4);
        *(ulong *)pGVar8 =
             *(ulong *)pGVar8 & 0xffffffffe0000000 | (ulong)(iVar5 - iVar6 & 0x1fffffff);
        iVar4 = Abc_LitIsCompl(iVar4);
        uVar1 = *(ulong *)pGVar8;
        *(ulong *)pGVar8 = uVar1 & 0xffffffffdfffffff | (ulong)(uint)(iVar4 << 0x1d);
        *(ulong *)pGVar8 =
             uVar1 & 0xe0000000dfffffff | (ulong)(uint)(iVar4 << 0x1d) |
             (ulong)(p_06->vCos->nSize & 0x1fffffff) << 0x20;
        p_00 = p_06->vCos;
        iVar4 = Gia_ObjId(p_06,pGVar8);
        Vec_IntPush(p_00,iVar4);
        if (p_06->pFanData != (int *)0x0) {
          Gia_ObjAddFanout(p_06,pGVar8 + -(ulong)((uint)*(undefined8 *)pGVar8 & 0x1fffffff),pGVar8);
        }
        Gia_ObjId(p_06,pGVar8);
        iVar3 = iVar3 + 1;
      } while( true );
    }
    iVar4 = Vec_IntEntry(p_03,iVar3);
    iVar5 = Vec_IntEntry(p_03,iVar3 + 1);
    iVar6 = Vec_IntEntry(p_03,iVar3 + 2);
    i = Vec_IntEntry(p_03,iVar3 + 3);
    iVar7 = Vec_BitEntry(p_04,iVar4);
    if (iVar7 == 0) {
LAB_00218746:
      iVar7 = Vec_BitEntry(p_04,iVar6);
      if (iVar7 != 0) {
        iVar7 = Vec_BitEntry(p_05,iVar6);
        if (iVar7 != 0) goto LAB_00218790;
      }
      iVar7 = Vec_BitEntry(p_04,i);
      if (iVar7 != 0) {
        iVar7 = Vec_BitEntry(p_05,i);
        if (iVar7 != 0) goto LAB_00218790;
      }
    }
    else {
      iVar7 = Vec_BitEntry(p_05,iVar4);
      if (iVar7 == 0) goto LAB_00218746;
LAB_00218790:
      p_01 = local_40;
      pGVar8 = Gia_ManObj(local_40,iVar4);
      local_38 = Gia_ManObj(p_01,iVar5);
      pGVar9 = Gia_ManObj(p_01,iVar6);
      pGVar14 = Gia_ManObj(p_01,i);
      if ((*(ulong *)pGVar8 & 0xc0000000) == 0 && (~(uint)*(ulong *)pGVar8 & 0x1fffffff) != 0) {
        Vec_IntPush(p_02,iVar4);
      }
      if ((*(ulong *)local_38 & 0xc0000000) == 0 && (~(uint)*(ulong *)local_38 & 0x1fffffff) != 0) {
        Vec_IntPush(p_02,iVar5);
      }
      if ((*(ulong *)pGVar9 & 0xc0000000) == 0 && (~(uint)*(ulong *)pGVar9 & 0x1fffffff) != 0) {
        Vec_IntPush(p_02,iVar6);
      }
      if ((*(ulong *)pGVar14 & 0xc0000000) == 0 && (~(uint)*(ulong *)pGVar14 & 0x1fffffff) != 0) {
        Vec_IntPush(p_02,i);
      }
    }
    iVar3 = iVar3 + 4;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManDupWithMuxPos( Gia_Man_t * p )
{
    Vec_Int_t * vPoints = Vec_IntAlloc( 1000 );
    Vec_Int_t * vQuads  = Vec_IntAlloc( 1000 );
    Vec_Bit_t * vHeads  = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Bit_t * vDatas  = Vec_BitStart( Gia_ManObjNum(p) );
    Gia_Obj_t * pObj, * pCtrl, * pData0, * pData1;
    Gia_Man_t * pNew = Gia_ManDup( p ); int i, iObj;
    assert( Gia_ManRegNum(pNew) == 0 );
    Gia_ManForEachAnd( pNew, pObj, i )
    {
        if ( !Gia_ObjIsMuxType(pObj) )
            continue;
        pCtrl  = Gia_ObjRecognizeMux( pObj, &pData1, &pData0 );
        pCtrl  = Gia_Regular(pCtrl);
        pData0 = Gia_Regular(pData0);
        pData1 = Gia_Regular(pData1);
        Vec_IntPushTwo( vQuads, Gia_ObjId(pNew, pObj),   Gia_ObjId(pNew, pCtrl)  );
        Vec_IntPushTwo( vQuads, Gia_ObjId(pNew, pData0), Gia_ObjId(pNew, pData1) );
        Vec_BitWriteEntry( vHeads, Gia_ObjId(pNew, pObj),   1 );
        Vec_BitWriteEntry( vDatas, Gia_ObjId(pNew, pData0), 1 );
        Vec_BitWriteEntry( vDatas, Gia_ObjId(pNew, pData1), 1 );
    }
    Gia_ManForEachCo( pNew, pObj, i )
        Gia_ObjFanin0(pObj)->fMark0 = 1;
    for ( i = 0; i < Vec_IntSize(vQuads)/4; i++ )
    {
        int iObj   = Vec_IntEntry( vQuads, 4*i+0 );
        int iCtrl  = Vec_IntEntry( vQuads, 4*i+1 );
        int iData0 = Vec_IntEntry( vQuads, 4*i+2 );
        int iData1 = Vec_IntEntry( vQuads, 4*i+3 );
        if ( (Vec_BitEntry(vHeads, iObj)   && Vec_BitEntry(vDatas, iObj))   || 
             (Vec_BitEntry(vHeads, iData0) && Vec_BitEntry(vDatas, iData0)) || 
             (Vec_BitEntry(vHeads, iData1) && Vec_BitEntry(vDatas, iData1)) )
        {
            Gia_Obj_t * pObj   = Gia_ManObj( p, iObj );
            Gia_Obj_t * pCtrl  = Gia_ManObj( p, iCtrl );
            Gia_Obj_t * pData0 = Gia_ManObj( p, iData0 );
            Gia_Obj_t * pData1 = Gia_ManObj( p, iData1 );
            if ( Gia_ObjIsAnd(pObj)   && !pObj->fMark0   )  Vec_IntPush( vPoints, iObj   );
            if ( Gia_ObjIsAnd(pCtrl)  && !pCtrl->fMark0  )  Vec_IntPush( vPoints, iCtrl  );
            if ( Gia_ObjIsAnd(pData0) && !pData0->fMark0 )  Vec_IntPush( vPoints, iData0 );
            if ( Gia_ObjIsAnd(pData1) && !pData1->fMark0 )  Vec_IntPush( vPoints, iData1 );
        }
    }
    Gia_ManCleanMark0( pNew );
    Vec_IntUniqify( vPoints );
    Vec_IntForEachEntry( vPoints, iObj, i )
        Gia_ManAppendCo( pNew, Abc_Var2Lit(iObj, 0) );
    Vec_IntFree( vPoints );
    Vec_IntFree( vQuads );
    Vec_BitFree( vHeads );
    Vec_BitFree( vDatas );
    return pNew;
}